

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall
Commands::Commands(Commands *this,transparent_set<Command> *commands_,
                  insensitive_map<std::string,_std::vector<const_Command_*>_> *alternators_,
                  transparent_map<std::string,_EntityType> *entities_,
                  transparent_map<std::string,_shared_ptr<Enum>_> *enums_)

{
  bool bVar1;
  pointer ppVar2;
  unsigned_short *__args;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view name_40;
  string_view name_41;
  string_view name_42;
  string_view name_43;
  basic_string_view<char,_std::char_traits<char>_> local_4d8;
  undefined1 local_4c8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_4c0;
  undefined1 local_4b0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_4a8;
  undefined1 local_498 [8];
  basic_string_view<char,_std::char_traits<char>_> local_490;
  undefined1 local_480 [8];
  basic_string_view<char,_std::char_traits<char>_> local_478;
  undefined1 local_468 [8];
  basic_string_view<char,_std::char_traits<char>_> local_460;
  undefined1 local_450 [8];
  basic_string_view<char,_std::char_traits<char>_> local_448;
  undefined1 local_438 [8];
  basic_string_view<char,_std::char_traits<char>_> local_430;
  undefined1 local_420 [8];
  basic_string_view<char,_std::char_traits<char>_> local_418;
  undefined1 local_408 [8];
  basic_string_view<char,_std::char_traits<char>_> local_400;
  undefined1 local_3f0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  undefined1 local_3d8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_3d0;
  undefined1 local_3c0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  undefined1 local_3a8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_3a0;
  undefined1 local_390 [8];
  basic_string_view<char,_std::char_traits<char>_> local_388;
  undefined1 local_378 [8];
  basic_string_view<char,_std::char_traits<char>_> local_370;
  undefined1 local_360 [8];
  basic_string_view<char,_std::char_traits<char>_> local_358;
  undefined1 local_348 [8];
  basic_string_view<char,_std::char_traits<char>_> local_340;
  undefined1 local_330 [8];
  basic_string_view<char,_std::char_traits<char>_> local_328;
  undefined1 local_318 [8];
  basic_string_view<char,_std::char_traits<char>_> local_310;
  undefined1 local_300 [8];
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  undefined1 local_2e8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_2e0;
  undefined1 local_2d0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  undefined1 local_2b8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  undefined1 local_2a0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_298;
  undefined1 local_288 [8];
  basic_string_view<char,_std::char_traits<char>_> local_280;
  undefined1 local_270 [8];
  basic_string_view<char,_std::char_traits<char>_> local_268;
  undefined1 local_258 [8];
  basic_string_view<char,_std::char_traits<char>_> local_250;
  undefined1 local_240 [8];
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined1 local_228 [8];
  basic_string_view<char,_std::char_traits<char>_> local_220;
  undefined1 local_210 [8];
  basic_string_view<char,_std::char_traits<char>_> local_208;
  undefined1 local_1f8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  undefined1 local_1e0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined1 local_1c8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  undefined1 local_1b0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined1 local_198 [8];
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined1 local_180 [8];
  basic_string_view<char,_std::char_traits<char>_> local_178;
  undefined1 local_168 [8];
  basic_string_view<char,_std::char_traits<char>_> local_160;
  undefined1 local_150 [8];
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_138 [8];
  basic_string_view<char,_std::char_traits<char>_> local_130;
  undefined1 local_120 [8];
  basic_string_view<char,_std::char_traits<char>_> local_118;
  undefined1 local_108 [8];
  basic_string_view<char,_std::char_traits<char>_> local_100;
  undefined1 local_f0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d8 [8];
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  undefined1 local_c0 [8];
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined1 local_a8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Command *cmd;
  iterator __end1;
  iterator __begin1;
  transparent_set<Command> *__range1;
  _Self local_68;
  _Self local_60;
  _Self local_58;
  iterator it_scriptstream;
  iterator it_model;
  _Self local_38;
  iterator it_defaultmodel;
  transparent_map<std::string,_shared_ptr<Enum>_> *enums__local;
  transparent_map<std::string,_EntityType> *entities__local;
  insensitive_map<std::string,_std::vector<const_Command_*>_> *alternators__local;
  transparent_set<Command> *commands__local;
  Commands *this_local;
  
  it_defaultmodel._M_node = (_Base_ptr)enums_;
  std::set<Command,_std::less<void>,_std::allocator<Command>_>::set(&this->commands,commands_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Command_*,_std::allocator<const_Command_*>_>,_iless,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_>_>_>
  ::map(&this->alternators,alternators_);
  std::
  multimap<unsigned_short,_const_Command_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_const_Command_*>_>_>
  ::multimap(&this->commands_by_id);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
  ::map(&this->enums,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
         *)it_defaultmodel._M_node);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::map(&this->entities,entities_);
  std::shared_ptr<Enum>::shared_ptr(&this->enum_models);
  std::shared_ptr<Enum>::shared_ptr(&this->enum_defaultmodels);
  std::shared_ptr<Enum>::shared_ptr(&this->enum_scriptstream);
  std::experimental::optional<const_Command_&>::optional(&this->set_progress_total);
  std::experimental::optional<const_Command_&>::optional(&this->set_total_number_of_missions);
  std::experimental::optional<const_Command_&>::optional(&this->set_collectable1_total);
  std::experimental::optional<const_Command_&>::optional(&this->register_mission_passed);
  std::experimental::optional<const_Command_&>::optional(&this->register_oddjob_mission_passed);
  std::experimental::optional<const_Command_&>::optional(&this->create_collectable1);
  std::experimental::optional<const_Command_&>::optional(&this->player_made_progress);
  std::experimental::optional<const_Command_&>::optional(&this->set_mission_respect_total);
  std::experimental::optional<const_Command_&>::optional(&this->award_player_mission_respect);
  std::experimental::optional<const_Command_&>::optional(&this->repeat);
  std::experimental::optional<const_Command_&>::optional(&this->switch_);
  std::experimental::optional<const_Command_&>::optional(&this->case_);
  std::experimental::optional<const_Command_&>::optional(&this->switch_start);
  std::experimental::optional<const_Command_&>::optional(&this->switch_continued);
  std::experimental::optional<const_Command_&>::optional(&this->gosub_file);
  std::experimental::optional<const_Command_&>::optional(&this->return_);
  std::experimental::optional<const_Command_&>::optional(&this->launch_mission);
  std::experimental::optional<const_Command_&>::optional(&this->load_and_launch_mission_internal);
  std::experimental::optional<const_Command_&>::optional(&this->start_new_script);
  std::experimental::optional<const_Command_&>::optional(&this->start_new_streamed_script);
  std::experimental::optional<const_Command_&>::optional(&this->terminate_this_script);
  std::experimental::optional<const_Command_&>::optional(&this->script_name);
  std::experimental::optional<const_Command_&>::optional(&this->cleo_call);
  std::experimental::optional<const_Command_&>::optional(&this->cleo_return);
  std::experimental::optional<const_Command_&>::optional(&this->terminate_this_custom_script);
  std::experimental::optional<const_Command_&>::optional(&this->goto_);
  std::experimental::optional<const_Command_&>::optional(&this->goto_if_false);
  std::experimental::optional<const_Command_&>::optional(&this->andor);
  std::experimental::optional<const_Command_&>::optional(&this->register_streamed_script_internal);
  std::experimental::optional<const_Command_&>::optional(&this->save_string_to_debug_file);
  std::experimental::optional<const_Command_&>::optional(&this->skip_cutscene_start);
  std::experimental::optional<const_Command_&>::optional(&this->skip_cutscene_end);
  std::experimental::optional<const_Command_&>::optional(&this->skip_cutscene_start_internal);
  std::experimental::optional<const_Command_&>::optional(&this->require);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->set);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->cset);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->add_thing_to_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->sub_thing_from_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->mult_thing_by_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->div_thing_by_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->add_thing_to_thing_timed);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->sub_thing_from_thing_timed);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->is_thing_equal_to_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->is_thing_greater_than_thing);
  std::experimental::
  optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>::optional
            (&this->is_thing_greater_or_equal_to_thing);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
       ::find<char[13]>(&this->enums,(char (*) [13])"DEFAULTMODEL");
  it_scriptstream =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
       ::find<char[6]>(&this->enums,(char (*) [6])0x3c331d);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
       ::find<char[13]>(&this->enums,(char (*) [13])"SCRIPTSTREAM");
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
       ::end(&this->enums);
  bVar1 = std::operator!=(&it_scriptstream,&local_60);
  if (!bVar1) {
    __assert_fail("it_model != this->enums.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                  ,0x12,
                  "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
                 );
  }
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
       ::end(&this->enums);
  bVar1 = std::operator!=(&local_38,&local_68);
  if (bVar1) {
    __range1 = (transparent_set<Command> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
               ::end(&this->enums);
    bVar1 = std::operator!=(&local_58,(_Self *)&__range1);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>
               ::operator->(&it_scriptstream);
      std::shared_ptr<Enum>::operator=(&this->enum_models,&ppVar2->second);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>
               ::operator->(&local_38);
      std::shared_ptr<Enum>::operator=(&this->enum_defaultmodels,&ppVar2->second);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>
               ::operator->(&local_58);
      std::shared_ptr<Enum>::operator=(&this->enum_scriptstream,&ppVar2->second);
      __end1 = std::set<Command,_std::less<void>,_std::allocator<Command>_>::begin(&this->commands);
      cmd = (Command *)
            std::set<Command,_std::less<void>,_std::allocator<Command>_>::end(&this->commands);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&cmd), bVar1) {
        local_90._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::_Rb_tree_const_iterator<Command>::operator*(&__end1);
        bVar1 = std::experimental::optional::operator_cast_to_bool
                          ((optional *)&((reference)local_90._M_pi)->id);
        if (bVar1) {
          __args = std::experimental::optional<unsigned_short>::operator*
                             ((optional<uint16_t> *)
                              ((long)&(local_90._M_pi)->_vptr__Sp_counted_base + 4));
          local_98._M_pi = local_90._M_pi;
          local_a8._8_8_ =
               std::
               multimap<unsigned_short,Command_const*,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
               ::emplace<unsigned_short_const&,Command_const*>
                         ((multimap<unsigned_short,Command_const*,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
                           *)&this->commands_by_id,__args,(Command **)&local_98);
        }
        std::_Rb_tree_const_iterator<Command>::operator++(&__end1);
      }
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"SET_PROGRESS_TOTAL");
      name.__size = (size_type)local_b8.__data;
      name.__data = (value_type *)this;
      find_command((Commands *)local_a8,name);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->set_progress_total,
                 (optional<const_Command_&> *)local_a8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d0,"SET_TOTAL_NUMBER_OF_MISSIONS");
      name_00.__size = (size_type)local_d0.__data;
      name_00.__data = (value_type *)this;
      find_command((Commands *)local_c0,name_00);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->set_total_number_of_missions,
                 (optional<const_Command_&> *)local_c0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"SET_COLLECTABLE1_TOTAL");
      name_01.__size = (size_type)local_e8.__data;
      name_01.__data = (value_type *)this;
      find_command((Commands *)local_d8,name_01);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->set_collectable1_total,
                 (optional<const_Command_&> *)local_d8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_100,"SET_MISSION_RESPECT_TOTAL");
      name_02.__size = (size_type)local_100.__data;
      name_02.__data = (value_type *)this;
      find_command((Commands *)local_f0,name_02);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->set_mission_respect_total,
                 (optional<const_Command_&> *)local_f0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_118,"REGISTER_MISSION_PASSED");
      name_03.__size = (size_type)local_118.__data;
      name_03.__data = (value_type *)this;
      find_command((Commands *)local_108,name_03);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->register_mission_passed,
                 (optional<const_Command_&> *)local_108);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_130,"REGISTER_ODDJOB_MISSION_PASSED");
      name_04.__size = (size_type)local_130.__data;
      name_04.__data = (value_type *)this;
      find_command((Commands *)local_120,name_04);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->register_oddjob_mission_passed,
                 (optional<const_Command_&> *)local_120);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_148,"CREATE_COLLECTABLE1");
      name_05.__size = (size_type)local_148.__data;
      name_05.__data = (value_type *)this;
      find_command((Commands *)local_138,name_05);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->create_collectable1,
                 (optional<const_Command_&> *)local_138);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_160,"AWARD_PLAYER_MISSION_RESPECT");
      name_06.__size = (size_type)local_160.__data;
      name_06.__data = (value_type *)this;
      find_command((Commands *)local_150,name_06);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->award_player_mission_respect,
                 (optional<const_Command_&> *)local_150);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_178,"PLAYER_MADE_PROGRESS");
      name_07.__size = (size_type)local_178.__data;
      name_07.__data = (value_type *)this;
      find_command((Commands *)local_168,name_07);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->player_made_progress,
                 (optional<const_Command_&> *)local_168);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_190,"REPEAT");
      name_08.__size = (size_type)local_190.__data;
      name_08.__data = (value_type *)this;
      find_command((Commands *)local_180,name_08);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->repeat,(optional<const_Command_&> *)local_180);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1a8,"SWITCH");
      name_09.__size = (size_type)local_1a8.__data;
      name_09.__data = (value_type *)this;
      find_command((Commands *)local_198,name_09);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->switch_,(optional<const_Command_&> *)local_198);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c0,"CASE");
      name_10.__size = (size_type)local_1c0.__data;
      name_10.__data = (value_type *)this;
      find_command((Commands *)local_1b0,name_10);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->case_,(optional<const_Command_&> *)local_1b0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1d8,"SWITCH_START");
      name_11.__size = (size_type)local_1d8.__data;
      name_11.__data = (value_type *)this;
      find_command((Commands *)local_1c8,name_11);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->switch_start,
                 (optional<const_Command_&> *)local_1c8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1f0,"SWITCH_CONTINUED");
      name_12.__size = (size_type)local_1f0.__data;
      name_12.__data = (value_type *)this;
      find_command((Commands *)local_1e0,name_12);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->switch_continued,
                 (optional<const_Command_&> *)local_1e0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_208,"GOSUB_FILE");
      name_13.__size = (size_type)local_208.__data;
      name_13.__data = (value_type *)this;
      find_command((Commands *)local_1f8,name_13);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->gosub_file,
                 (optional<const_Command_&> *)local_1f8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_220,"LAUNCH_MISSION");
      name_14.__size = (size_type)local_220.__data;
      name_14.__data = (value_type *)this;
      find_command((Commands *)local_210,name_14);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->launch_mission,
                 (optional<const_Command_&> *)local_210);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_238,"LOAD_AND_LAUNCH_MISSION_INTERNAL");
      name_15.__size = (size_type)local_238.__data;
      name_15.__data = (value_type *)this;
      find_command((Commands *)local_228,name_15);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->load_and_launch_mission_internal,
                 (optional<const_Command_&> *)local_228);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_250,"START_NEW_SCRIPT");
      name_16.__size = (size_type)local_250.__data;
      name_16.__data = (value_type *)this;
      find_command((Commands *)local_240,name_16);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->start_new_script,
                 (optional<const_Command_&> *)local_240);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_268,"START_NEW_STREAMED_SCRIPT");
      name_17.__size = (size_type)local_268.__data;
      name_17.__data = (value_type *)this;
      find_command((Commands *)local_258,name_17);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->start_new_streamed_script,
                 (optional<const_Command_&> *)local_258);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_280,"TERMINATE_THIS_SCRIPT");
      name_18.__size = (size_type)local_280.__data;
      name_18.__data = (value_type *)this;
      find_command((Commands *)local_270,name_18);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->terminate_this_script,
                 (optional<const_Command_&> *)local_270);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_298,"SCRIPT_NAME");
      name_19.__size = (size_type)local_298.__data;
      name_19.__data = (value_type *)this;
      find_command((Commands *)local_288,name_19);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->script_name,
                 (optional<const_Command_&> *)local_288);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2b0,"RETURN");
      name_20.__size = (size_type)local_2b0.__data;
      name_20.__data = (value_type *)this;
      find_command((Commands *)local_2a0,name_20);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->return_,(optional<const_Command_&> *)local_2a0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2c8,"CLEO_CALL");
      name_21.__size = (size_type)local_2c8.__data;
      name_21.__data = (value_type *)this;
      find_command((Commands *)local_2b8,name_21);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->cleo_call,(optional<const_Command_&> *)local_2b8
                );
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2e0,"CLEO_RETURN");
      name_22.__size = (size_type)local_2e0.__data;
      name_22.__data = (value_type *)this;
      find_command((Commands *)local_2d0,name_22);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->cleo_return,
                 (optional<const_Command_&> *)local_2d0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2f8,"TERMINATE_THIS_CUSTOM_SCRIPT");
      name_23.__size = (size_type)local_2f8.__data;
      name_23.__data = (value_type *)this;
      find_command((Commands *)local_2e8,name_23);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->terminate_this_custom_script,
                 (optional<const_Command_&> *)local_2e8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_310,"GOTO");
      name_24.__size = (size_type)local_310.__data;
      name_24.__data = (value_type *)this;
      find_command((Commands *)local_300,name_24);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->goto_,(optional<const_Command_&> *)local_300);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_328,"GOTO_IF_FALSE");
      name_25.__size = (size_type)local_328.__data;
      name_25.__data = (value_type *)this;
      find_command((Commands *)local_318,name_25);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->goto_if_false,
                 (optional<const_Command_&> *)local_318);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_340,"ANDOR");
      name_26.__size = (size_type)local_340.__data;
      name_26.__data = (value_type *)this;
      find_command((Commands *)local_330,name_26);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->andor,(optional<const_Command_&> *)local_330);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_358,"SAVE_STRING_TO_DEBUG_FILE");
      name_27.__size = (size_type)local_358.__data;
      name_27.__data = (value_type *)this;
      find_command((Commands *)local_348,name_27);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->save_string_to_debug_file,
                 (optional<const_Command_&> *)local_348);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_370,"SKIP_CUTSCENE_START");
      name_28.__size = (size_type)local_370.__data;
      name_28.__data = (value_type *)this;
      find_command((Commands *)local_360,name_28);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->skip_cutscene_start,
                 (optional<const_Command_&> *)local_360);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_388,"SKIP_CUTSCENE_END");
      name_29.__size = (size_type)local_388.__data;
      name_29.__data = (value_type *)this;
      find_command((Commands *)local_378,name_29);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->skip_cutscene_end,
                 (optional<const_Command_&> *)local_378);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3a0,"SKIP_CUTSCENE_START_INTERNAL");
      name_30.__size = (size_type)local_3a0.__data;
      name_30.__data = (value_type *)this;
      find_command((Commands *)local_390,name_30);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->skip_cutscene_start_internal,
                 (optional<const_Command_&> *)local_390);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3b8,"SET");
      name_31.__size = (size_type)local_3b8.__data;
      name_31.__data = (value_type *)this;
      find_alternator((Commands *)local_3a8,name_31);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->set,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_3a8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3d0,"CSET");
      name_32.__size = (size_type)local_3d0.__data;
      name_32.__data = (value_type *)this;
      find_alternator((Commands *)local_3c0,name_32);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->cset,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_3c0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3e8,"ADD_THING_TO_THING");
      name_33.__size = (size_type)local_3e8.__data;
      name_33.__data = (value_type *)this;
      find_alternator((Commands *)local_3d8,name_33);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->add_thing_to_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_3d8);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_400,"SUB_THING_FROM_THING");
      name_34.__size = (size_type)local_400.__data;
      name_34.__data = (value_type *)this;
      find_alternator((Commands *)local_3f0,name_34);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->sub_thing_from_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_3f0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_418,"MULT_THING_BY_THING");
      name_35.__size = (size_type)local_418.__data;
      name_35.__data = (value_type *)this;
      find_alternator((Commands *)local_408,name_35);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->mult_thing_by_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_408);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_430,"DIV_THING_BY_THING");
      name_36.__size = (size_type)local_430.__data;
      name_36.__data = (value_type *)this;
      find_alternator((Commands *)local_420,name_36);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->div_thing_by_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_420);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_448,"ADD_THING_TO_THING_TIMED");
      name_37.__size = (size_type)local_448.__data;
      name_37.__data = (value_type *)this;
      find_alternator((Commands *)local_438,name_37);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->add_thing_to_thing_timed,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_438);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_460,"SUB_THING_FROM_THING_TIMED");
      name_38.__size = (size_type)local_460.__data;
      name_38.__data = (value_type *)this;
      find_alternator((Commands *)local_450,name_38);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->sub_thing_from_thing_timed,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_450);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_478,"IS_THING_EQUAL_TO_THING");
      name_39.__size = (size_type)local_478.__data;
      name_39.__data = (value_type *)this;
      find_alternator((Commands *)local_468,name_39);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->is_thing_equal_to_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_468);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_490,"IS_THING_GREATER_THAN_THING");
      name_40.__size = (size_type)local_490.__data;
      name_40.__data = (value_type *)this;
      find_alternator((Commands *)local_480,name_40);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->is_thing_greater_than_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_480);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4a8,"IS_THING_GREATER_OR_EQUAL_TO_THING");
      name_41.__size = (size_type)local_4a8.__data;
      name_41.__data = (value_type *)this;
      find_alternator((Commands *)local_498,name_41);
      std::experimental::optional<std::vector<Command_const*,std::allocator<Command_const*>>const&>
      ::operator=((optional<std::vector<Command_const*,std::allocator<Command_const*>>const&> *)
                  &this->is_thing_greater_or_equal_to_thing,
                  (optional<const_std::vector<const_Command_*,_std::allocator<const_Command_*>_>_&>
                   *)local_498);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4c0,"REGISTER_STREAMED_SCRIPT_INTERNAL");
      name_42.__size = (size_type)local_4c0.__data;
      name_42.__data = (value_type *)this;
      find_command((Commands *)local_4b0,name_42);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->register_streamed_script_internal,
                 (optional<const_Command_&> *)local_4b0);
      libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4d8,"REQUIRE");
      name_43.__size = (size_type)local_4d8.__data;
      name_43.__data = (value_type *)this;
      find_command((Commands *)local_4c8,name_43);
      std::experimental::optional<Command_const&>::operator=
                ((optional<Command_const&> *)&this->require,(optional<const_Command_&> *)local_4c8);
      return;
    }
    __assert_fail("it_scriptstream != this->enums.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                  ,0x14,
                  "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
                 );
  }
  __assert_fail("it_defaultmodel != this->enums.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                ,0x13,
                "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
               );
}

Assistant:

Commands::Commands(transparent_set<Command>&& commands_,
                   insensitive_map<std::string, std::vector<const Command*>>&& alternators_,
                   transparent_map<std::string, EntityType>&& entities_,
                   transparent_map<std::string, shared_ptr<Enum>>&& enums_)

    : commands(std::move(commands_)), alternators(std::move(alternators_)),
      enums(std::move(enums_)), entities(std::move(entities_))
{
    auto it_defaultmodel = this->enums.find("DEFAULTMODEL");
    auto it_model       = this->enums.find("MODEL");
    auto it_scriptstream= this->enums.find("SCRIPTSTREAM");

    assert(it_model != this->enums.end());
    assert(it_defaultmodel != this->enums.end());
    assert(it_scriptstream != this->enums.end());

    this->enum_models = it_model->second;
    this->enum_defaultmodels = it_defaultmodel->second;
    this->enum_scriptstream = it_scriptstream->second;
    
    for(auto& cmd : this->commands)
    {
        if(cmd.id)
            this->commands_by_id.emplace(*cmd.id, std::addressof(cmd));
    }

    this->set_progress_total            = find_command("SET_PROGRESS_TOTAL");
    this->set_total_number_of_missions  = find_command("SET_TOTAL_NUMBER_OF_MISSIONS");
    this->set_collectable1_total        = find_command("SET_COLLECTABLE1_TOTAL");
    this->set_mission_respect_total     = find_command("SET_MISSION_RESPECT_TOTAL");
    this->register_mission_passed       = find_command("REGISTER_MISSION_PASSED");
    this->register_oddjob_mission_passed= find_command("REGISTER_ODDJOB_MISSION_PASSED");
    this->create_collectable1           = find_command("CREATE_COLLECTABLE1");
    this->award_player_mission_respect  = find_command("AWARD_PLAYER_MISSION_RESPECT");
    this->player_made_progress          = find_command("PLAYER_MADE_PROGRESS");
    this->repeat                        = find_command("REPEAT");
    this->switch_                       = find_command("SWITCH");
    this->case_                         = find_command("CASE");
    this->switch_start                  = find_command("SWITCH_START");
    this->switch_continued              = find_command("SWITCH_CONTINUED");
    this->gosub_file                    = find_command("GOSUB_FILE");
    this->launch_mission                = find_command("LAUNCH_MISSION");
    this->load_and_launch_mission_internal = find_command("LOAD_AND_LAUNCH_MISSION_INTERNAL");
    this->start_new_script              = find_command("START_NEW_SCRIPT");
    this->start_new_streamed_script     = find_command("START_NEW_STREAMED_SCRIPT");
    this->terminate_this_script         = find_command("TERMINATE_THIS_SCRIPT");
    this->script_name                   = find_command("SCRIPT_NAME");
    this->return_                        = find_command("RETURN");
    this->cleo_call                     = find_command("CLEO_CALL");
    this->cleo_return                   = find_command("CLEO_RETURN");
    this->terminate_this_custom_script  = find_command("TERMINATE_THIS_CUSTOM_SCRIPT");
    this->goto_                          = find_command("GOTO");
    this->goto_if_false                 = find_command("GOTO_IF_FALSE");
    this->andor                         = find_command("ANDOR");
    this->save_string_to_debug_file     = find_command("SAVE_STRING_TO_DEBUG_FILE");
    this->skip_cutscene_start           = find_command("SKIP_CUTSCENE_START");
    this->skip_cutscene_end             = find_command("SKIP_CUTSCENE_END");
    this->skip_cutscene_start_internal  = find_command("SKIP_CUTSCENE_START_INTERNAL");
    this->set                           = find_alternator("SET");
    this->cset                          = find_alternator("CSET");
    this->add_thing_to_thing            = find_alternator("ADD_THING_TO_THING");
    this->sub_thing_from_thing          = find_alternator("SUB_THING_FROM_THING");
    this->mult_thing_by_thing           = find_alternator("MULT_THING_BY_THING");
    this->div_thing_by_thing            = find_alternator("DIV_THING_BY_THING");
    this->add_thing_to_thing_timed      = find_alternator("ADD_THING_TO_THING_TIMED");
    this->sub_thing_from_thing_timed    = find_alternator("SUB_THING_FROM_THING_TIMED");
    this->is_thing_equal_to_thing       = find_alternator("IS_THING_EQUAL_TO_THING");
    this->is_thing_greater_than_thing   = find_alternator("IS_THING_GREATER_THAN_THING");
    this->is_thing_greater_or_equal_to_thing = find_alternator("IS_THING_GREATER_OR_EQUAL_TO_THING");
    this->register_streamed_script_internal = find_command("REGISTER_STREAMED_SCRIPT_INTERNAL");
    this->require                       = find_command("REQUIRE");
}